

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

void xmlDebugErr(xmlDebugCtxtPtr ctxt,int error,char *msg)

{
  char *msg_local;
  int error_local;
  xmlDebugCtxtPtr ctxt_local;
  
  ctxt->errors = ctxt->errors + 1;
  __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                  ctxt->node,0x18,error,XML_ERR_ERROR,(char *)0x0,0,(char *)0x0,(char *)0x0,
                  (char *)0x0,0,0,"%s",msg);
  return;
}

Assistant:

static void
xmlDebugErr(xmlDebugCtxtPtr ctxt, int error, const char *msg)
{
    ctxt->errors++;
    __xmlRaiseError(NULL, NULL, NULL,
		    NULL, ctxt->node, XML_FROM_CHECK,
		    error, XML_ERR_ERROR, NULL, 0,
		    NULL, NULL, NULL, 0, 0,
		    "%s", msg);
}